

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void rw::ps2::objUninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  Geometry *this;
  InstanceDataHeader *pIVar2;
  uint32 uVar3;
  uint32 *__s;
  uint8 *puVar4;
  int32 extraout_EDX;
  long lVar5;
  MatPipeline *pMVar6;
  int32 iVar7;
  int8 *adc;
  Mesh *m;
  ulong uVar8;
  long lVar9;
  uint8 *data [10];
  uint8 *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    pIVar2 = this->instData;
    this->numVertices = this->meshHeader->totalIndices;
    uVar3 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar3;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/ps2/ps2.cpp line: 889"
    ;
    __s = (uint32 *)(*DAT_00149da8)((long)this->numVertices << 2);
    memset(__s,0,(long)this->numVertices << 2);
    memset(*(void **)(this->meshHeader + 1),0,(ulong)(this->meshHeader->totalIndices * 2));
    if (pIVar2[1].platform != 0) {
      lVar5 = 0x20;
      uVar8 = 0;
      do {
        pMVar6 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = *(MatPipeline **)(*(long *)((long)&this->meshHeader->flags + lVar5) + 0x18);
        }
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = defaultMatPipe;
        }
        if (pMVar6->preUninstCB != (_func_void_MatPipeline_ptr_Geometry_ptr *)0x0) {
          (*pMVar6->preUninstCB)(pMVar6,this);
        }
        uVar8 = uVar8 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar8 < pIVar2[1].platform);
    }
    this->numVertices = 0;
    if (pIVar2[1].platform != 0) {
      lVar9 = 0x10;
      lVar5 = 0;
      uVar8 = 0;
      do {
        pMVar6 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = *(MatPipeline **)(*(long *)((long)&this->meshHeader[1].flags + lVar9) + 0x18);
        }
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = defaultMatPipe;
        }
        m = (Mesh *)((long)&this->meshHeader->flags + lVar9);
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_88 = (uint8 *)0x0;
        uStack_80 = 0;
        puVar4 = MatPipeline::collectData
                           (pMVar6,this,(InstanceData *)(*(long *)(pIVar2 + 2) + lVar5),m,&local_88)
        ;
        (*pMVar6->uninstanceCB)(pMVar6,this,__s,m,&local_88);
        (*DAT_00149da0)(puVar4);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
        lVar5 = lVar5 + 0x20;
      } while (uVar8 < pIVar2[1].platform);
    }
    if (pIVar2[1].platform != 0) {
      lVar5 = 0x20;
      uVar8 = 0;
      do {
        pMVar6 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = *(MatPipeline **)(*(long *)((long)&this->meshHeader->flags + lVar5) + 0x18);
        }
        if (pMVar6 == (MatPipeline *)0x0) {
          pMVar6 = defaultMatPipe;
        }
        if (pMVar6->postUninstCB != (_func_void_MatPipeline_ptr_Geometry_ptr *)0x0) {
          (*pMVar6->postUninstCB)(pMVar6,this);
        }
        uVar8 = uVar8 + 1;
        lVar5 = lVar5 + 0x18;
      } while (uVar8 < pIVar2[1].platform);
    }
    lVar5 = (long)adcOffset;
    if ((lVar5 == 0) || (*(int *)((long)this->texCoords + lVar5 + -0x38) == 0)) {
      adc = (int8 *)0x0;
    }
    else {
      adc = *(int8 **)((long)this->texCoords + lVar5 + -0x30);
    }
    Geometry::generateTriangles(this,adc);
    iVar7 = (int32)adc;
    (*DAT_00149da0)(__s);
    pbVar1 = (byte *)((long)&this->flags + 3);
    *pbVar1 = *pbVar1 & 0xfe;
    destroyNativeData(this,iVar7,extraout_EDX);
  }
  return;
}

Assistant:

static void
objUninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	// highest possible number of vertices
	geo->numVertices = geo->meshHeader->totalIndices;
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);
	uint32 *flags = rwNewT(uint32, geo->numVertices,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	memset(flags, 0, 4*geo->numVertices);
	memset(geo->meshHeader->getMeshes()->indices, 0, 2*geo->meshHeader->totalIndices);
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->preUninstCB) m->preUninstCB(m, geo);
	}
	geo->numVertices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		InstanceData *instance = &header->instanceMeshes[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;

		//printDMAVIF(instance);
		uint8 *data[nelem(m->attribs)] = { nil };
		uint8 *raw = m->collectData(geo, instance, mesh, data);
		assert(m->uninstanceCB);
		m->uninstanceCB(m, geo, flags, mesh, data);
		rwFree(raw);
	}
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->postUninstCB) m->postUninstCB(m, geo);
	}

	int8 *bits = getADCbits(geo);
	geo->generateTriangles(bits);
	rwFree(flags);
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
/*
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->mesh[i];
		InstanceData *instance = &header->instanceMeshes[i];
//		printf("numIndices: %d\n", mesh->numIndices);
//		printDMA(instance);
		printVertCounts(instance, geo->meshHeader->flags);
	}
*/
}